

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int s_sha1_compress(sha1_state *md,uchar *buf)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint local_17c;
  ulong32 t;
  ulong32 i;
  ulong32 W [80];
  ulong32 local_2c;
  uint local_28;
  ulong32 e;
  ulong32 d;
  ulong32 c;
  ulong32 b;
  ulong32 a;
  uchar *buf_local;
  sha1_state *md_local;
  
  for (local_17c = 0; local_17c < 0x10; local_17c = local_17c + 1) {
    (&t)[local_17c] =
         (uint)buf[local_17c << 2] << 0x18 | (uint)buf[(ulong)(local_17c << 2) + 1] << 0x10 |
         (uint)buf[(ulong)(local_17c << 2) + 2] << 8 | (uint)buf[(ulong)(local_17c << 2) + 3];
  }
  c = md->state[0];
  d = md->state[1];
  e = md->state[2];
  local_28 = md->state[3];
  local_2c = md->state[4];
  for (local_17c = 0x10; local_17c < 0x50; local_17c = local_17c + 1) {
    (&t)[local_17c] =
         ((&t)[local_17c - 3] ^ (&t)[local_17c - 8] ^ (&t)[local_17c - 0xe] ^ (&t)[local_17c - 0x10]
         ) << 1 | ((&t)[local_17c - 3] ^ (&t)[local_17c - 8] ^ (&t)[local_17c - 0xe] ^
                  (&t)[local_17c - 0x10]) >> 0x1f;
  }
  for (local_17c = 0; local_17c < 0x14; local_17c = local_17c + 1) {
    iVar1 = (c << 5 | c >> 0x1b) + (local_28 ^ d & (e ^ local_28)) + local_2c;
    uVar4 = (ulong)local_17c;
    uVar3 = d << 0x1e;
    uVar2 = d >> 2;
    local_2c = local_28;
    local_28 = e;
    d = c;
    e = uVar3 | uVar2;
    c = iVar1 + (&t)[uVar4] + 0x5a827999;
  }
  for (; local_17c < 0x28; local_17c = local_17c + 1) {
    iVar1 = (c << 5 | c >> 0x1b) + (d ^ e ^ local_28) + local_2c;
    uVar4 = (ulong)local_17c;
    uVar3 = d << 0x1e;
    uVar2 = d >> 2;
    local_2c = local_28;
    local_28 = e;
    d = c;
    e = uVar3 | uVar2;
    c = iVar1 + (&t)[uVar4] + 0x6ed9eba1;
  }
  for (; local_17c < 0x3c; local_17c = local_17c + 1) {
    iVar1 = (c << 5 | c >> 0x1b) + (d & e | local_28 & (d | e)) + local_2c;
    uVar4 = (ulong)local_17c;
    uVar3 = d << 0x1e;
    uVar2 = d >> 2;
    local_2c = local_28;
    local_28 = e;
    d = c;
    e = uVar3 | uVar2;
    c = iVar1 + (&t)[uVar4] + 0x8f1bbcdc;
  }
  for (; local_17c < 0x50; local_17c = local_17c + 1) {
    iVar1 = (c << 5 | c >> 0x1b) + (d ^ e ^ local_28) + local_2c;
    uVar4 = (ulong)local_17c;
    uVar3 = d << 0x1e;
    uVar2 = d >> 2;
    local_2c = local_28;
    local_28 = e;
    d = c;
    e = uVar3 | uVar2;
    c = iVar1 + (&t)[uVar4] + 0xca62c1d6;
  }
  md->state[0] = md->state[0] + c;
  md->state[1] = md->state[1] + d;
  md->state[2] = md->state[2] + e;
  md->state[3] = md->state[3] + local_28;
  md->state[4] = md->state[4] + local_2c;
  return 0;
}

Assistant:

static int s_sha1_compress(struct sha1_state *md, const unsigned char *buf)
{
    ulong32 a,b,c,d,e,W[80],i;
    ulong32 t;

    /* copy the state into 512-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD32H(W[i], buf + (4*i));
    }

    /* copy state */
    a = md->state[0];
    b = md->state[1];
    c = md->state[2];
    d = md->state[3];
    e = md->state[4];

    /* expand it */
    for (i = 16; i < 80; i++) {
        W[i] = ROL(W[i-3] ^ W[i-8] ^ W[i-14] ^ W[i-16], 1);
    }

    /* compress */
    /* round one */
    #define FF0(a,b,c,d,e,i) e = (ROLc(a, 5) + F0(b,c,d) + e + W[i] + 0x5a827999UL); b = ROLc(b, 30);
    #define FF1(a,b,c,d,e,i) e = (ROLc(a, 5) + F1(b,c,d) + e + W[i] + 0x6ed9eba1UL); b = ROLc(b, 30);
    #define FF2(a,b,c,d,e,i) e = (ROLc(a, 5) + F2(b,c,d) + e + W[i] + 0x8f1bbcdcUL); b = ROLc(b, 30);
    #define FF3(a,b,c,d,e,i) e = (ROLc(a, 5) + F3(b,c,d) + e + W[i] + 0xca62c1d6UL); b = ROLc(b, 30);

    for (i = 0; i < 20; ) {
       FF0(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 40; ) {
       FF1(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 60; ) {
       FF2(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 80; ) {
       FF3(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }

    #undef FF0
    #undef FF1
    #undef FF2
    #undef FF3

    /* store */
    md->state[0] = md->state[0] + a;
    md->state[1] = md->state[1] + b;
    md->state[2] = md->state[2] + c;
    md->state[3] = md->state[3] + d;
    md->state[4] = md->state[4] + e;

    return 0;
}